

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_address.h
# Opt level: O3

void __thiscall
cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
          (ElementsConfidentialAddress *this)

{
  pointer pcVar1;
  pointer puVar2;
  
  pcVar1 = (this->address_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->address_).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (this->confidential_key_).data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&(this->unblinded_address_).format_data_);
  Script::~Script(&(this->unblinded_address_).redeem_script_);
  (this->unblinded_address_).script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&(this->unblinded_address_).script_tree_.nodes_);
  TapBranch::~TapBranch(&(this->unblinded_address_).script_tree_.super_TapBranch);
  puVar2 = (this->unblinded_address_).schnorr_pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->unblinded_address_).pubkey_.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  puVar2 = (this->unblinded_address_).hash_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  pcVar1 = (this->unblinded_address_).address_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->unblinded_address_).address_.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

class CFD_CORE_EXPORT ElementsConfidentialAddress {
 public:
  /**
   * @brief get default blinding key.
   * @param[in] master_blinding_key master blindingKey
   * @param[in] locking_script      locking script by address.
   * @return blinding key
   */
  static Privkey GetBlindingKey(
      const Privkey& master_blinding_key, const Script& locking_script);

  /**
   * @brief default constructor.
   */
  ElementsConfidentialAddress();

  /**
   * @brief constructor. (Generate Confidential Address from Unblinded Address)
   * @param unblinded_address UnblindedAddress instance
   * @param confidential_key  ConfidentialKey instance
   */
  explicit ElementsConfidentialAddress(
      const Address& unblinded_address,
      const ConfidentialKey& confidential_key);

  /**
   * @brief constructor. (Decoding from the ConfidentialAddress string)
   * @param[in] confidential_address confidential address string.
   */
  explicit ElementsConfidentialAddress(
      const std::string& confidential_address);

  /**
   * @brief constructor. (Decoding from the ConfidentialAddress string)
   * @param[in] confidential_address confidential address string.
   * @param[in] prefix_list  address prefix list
   */
  explicit ElementsConfidentialAddress(
      const std::string& confidential_address,
      const std::vector<AddressFormatData>& prefix_list);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   */
  ElementsConfidentialAddress(const ElementsConfidentialAddress& object);
  /**
   * @brief copy constructor.
   * @param[in] object    object
   * @return object
   */
  ElementsConfidentialAddress& operator=(
      const ElementsConfidentialAddress& object) &;

  /**
   * @brief Get UnblindedAddress
   * @return UnblindedAddress instance associated with ConfidentialAddress
   */
  Address GetUnblindedAddress() const;

  /**
   * @brief Get Confidential Key
   * @return Confidential Key instance associated with Confidential Address
   */
  ConfidentialKey GetConfidentialKey() const;

  /**
   * @brief Get the address string.
   * @return address string.
   */
  std::string GetAddress() const;

  /**
   * @brief Get the ElementsNetType of Address.
   * @return ElementsNetType
   */
  ElementsNetType GetNetType() const;

  /**
   * @brief Get the Address type.
   * @return Address type.
   */
  ElementsAddressType GetAddressType() const;

  /**
   * @brief Get the address Hash.
   * @return address Hash.
   */
  ByteData GetHash() const;

  /**
   * @brief Get LockingScript
   * @return locking script
   */
  Script GetLockingScript() const;

  /**
   * @brief Determines if the specified address is a Blinded address
   * @param address     address string
   * @retval true   has blind address
   * @retval false  not blind address
   */
  static bool IsConfidentialAddress(const std::string& address);

  /**
   * @brief Determines if the specified address is a Blinded address
   * @param[in] address     address string
   * @param[in] prefix_list     address prefix list
   * @retval true   has blind address
   * @retval false  not blind address
   */
  static bool IsConfidentialAddress(
      const std::string& address,
      const std::vector<AddressFormatData>& prefix_list);

 private:
  /**
   * @brief Decode the model from the confidential address string
   * @param[in] confidential_address  confidential address string
   * @param[in] prefix_list           address prefix list
   */
  void DecodeAddress(
      const std::string& confidential_address,
      const std::vector<AddressFormatData>& prefix_list);

  /**
   * @brief Calculate the confidential_address from the unblinded_address and confidential_key.
   * @details For the network type of Elements, the calculation is performed \
   *   on the same type of network as connected_address.
   * @param unblinded_address UnblindedAddress
   * @param confidential_key Confidential Key instance used for Blind
   */
  void CalculateAddress(
      const Address& unblinded_address,
      const ConfidentialKey& confidential_key);

  /// Unblinded Address
  Address unblinded_address_;

  /// Confidential Key
  ConfidentialKey confidential_key_;

  /// address string
  std::string address_;
}